

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ZeroCopyInputStream *pZVar4;
  pointer pMVar5;
  ulong uVar6;
  DiskFileToVirtualFileResult DVar7;
  long lVar8;
  DiskSourceTree *this_00;
  string canonical_disk_file;
  string local_70;
  string local_50;
  
  pcVar1 = (disk_file->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + disk_file->_M_string_length);
  CanonicalizePath(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pMVar5 = (this->mappings_).
           super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
           ._M_impl.super__Vector_impl_data._M_start;
  DVar7 = NO_MAPPING;
  if ((this->mappings_).
      super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      this_00 = (DiskSourceTree *)&local_50;
      bVar2 = ApplyMapping(&local_50,(string *)((long)&(pMVar5->disk_path)._M_dataplus._M_p + lVar8)
                           ,(string *)((long)&(pMVar5->virtual_path)._M_dataplus._M_p + lVar8),
                           virtual_file);
      if (bVar2) {
        if (uVar6 == 0) goto LAB_0030da31;
        lVar8 = 0x20;
        goto LAB_0030d9fb;
      }
      uVar6 = uVar6 + 1;
      pMVar5 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
    } while (uVar6 < (ulong)((long)(this->mappings_).
                                   super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 6));
    DVar7 = NO_MAPPING;
  }
  goto LAB_0030da66;
LAB_0030d9fb:
  do {
    pMVar5 = (this->mappings_).
             super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (DiskSourceTree *)virtual_file;
    bVar2 = ApplyMapping(virtual_file,(string *)((long)pMVar5 + lVar8 + -0x20),
                         (string *)((long)&(pMVar5->virtual_path)._M_dataplus._M_p + lVar8),
                         shadowing_disk_file);
    if (bVar2) {
      this_00 = (DiskSourceTree *)(shadowing_disk_file->_M_dataplus)._M_p;
      iVar3 = access((char *)this_00,0);
      if (-1 < iVar3) {
        DVar7 = SHADOWED;
        goto LAB_0030da66;
      }
    }
    lVar8 = lVar8 + 0x40;
    uVar6 = uVar6 - 1;
  } while (uVar6 != 0);
LAB_0030da31:
  shadowing_disk_file->_M_string_length = 0;
  *(shadowing_disk_file->_M_dataplus)._M_p = '\0';
  pZVar4 = OpenDiskFile(this_00,disk_file);
  if (pZVar4 == (ZeroCopyInputStream *)0x0) {
    DVar7 = CANNOT_OPEN;
  }
  else {
    (*pZVar4->_vptr_ZeroCopyInputStream[1])(pZVar4);
    DVar7 = SUCCESS;
  }
LAB_0030da66:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return DVar7;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(const std::string& disk_file,
                                      std::string* virtual_file,
                                      std::string* shadowing_disk_file) {
  int mapping_index = -1;
  std::string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  std::unique_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}